

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transit.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Transit::exportKey
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Transit *this,KeyType *keyType,Path *path,Path *version)

{
  Client *client;
  string local_110;
  Path local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Url local_70;
  string local_50;
  
  client = *(Client **)this;
  Vault::operator+(&local_50,"export/",keyType);
  std::operator+(&local_d0,&local_50,"/");
  Vault::operator+(&local_b0,&local_d0,path);
  std::operator+(&local_90,&local_b0,"/");
  Vault::operator+(&local_110,&local_90,version);
  local_f0.value_._M_dataplus._M_p = (pointer)&local_f0.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p == &local_110.field_2) {
    local_f0.value_.field_2._8_8_ = local_110.field_2._8_8_;
  }
  else {
    local_f0.value_._M_dataplus._M_p = local_110._M_dataplus._M_p;
  }
  local_f0.value_._M_string_length = local_110._M_string_length;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  getUrl(&local_70,this,&local_f0);
  HttpConsumer::get(__return_storage_ptr__,client,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Transit::exportKey(const KeyType &keyType,
                                                     const Path &path,
                                                     const Path &version) {
  return HttpConsumer::get(
      client_, getUrl(Path{"export/" + keyType + "/" + path + "/" + version}));
}